

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
hufUnpackEncTable(uint8_t **pcode,uint64_t *nLeft,uint32_t im,uint32_t iM,uint64_t *hcode)

{
  uint64_t uVar1;
  uint in_ECX;
  uint in_EDX;
  ulong *in_RSI;
  long *in_RDI;
  void *in_R8;
  uint64_t zerun;
  uint64_t l;
  uint32_t lc;
  uint64_t nr;
  uint64_t ni;
  uint64_t c;
  uint8_t *p;
  uint64_t *in_stack_00000120;
  long local_60;
  uint32_t local_4c;
  ulong local_48;
  ulong local_40;
  uint64_t local_38;
  uint8_t *local_30;
  void *local_28;
  uint local_20;
  uint local_1c;
  ulong *local_18;
  long *local_10;
  
  local_30 = (uint8_t *)*in_RDI;
  local_38 = 0;
  local_40 = *in_RSI;
  local_4c = 0;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(in_R8,0,0x80008);
  while( true ) {
    if (local_20 < local_1c) {
      local_48 = (long)local_30 - *local_10;
      *local_18 = *local_18 - local_48;
      *local_10 = (long)local_30;
      hufCanonicalCodeTable(in_stack_00000120);
      return 0;
    }
    local_48 = (long)local_30 - *local_10;
    if ((local_4c < 6) && (local_40 <= local_48)) break;
    uVar1 = getBits(6,&local_38,&local_4c,&local_30);
    *(uint64_t *)((long)local_28 + (ulong)local_1c * 8) = uVar1;
    if (uVar1 == 0x3f) {
      local_48 = (long)local_30 - *local_10;
      if ((local_4c < 8) && (local_40 <= local_48)) {
        return 1;
      }
      uVar1 = getBits(8,&local_38,&local_4c,&local_30);
      local_60 = uVar1 + 6;
      if ((ulong)(local_20 + 1) < (ulong)local_1c + local_60) {
        return 0x17;
      }
      while (local_60 != 0) {
        *(undefined8 *)((long)local_28 + (ulong)local_1c * 8) = 0;
        local_60 = local_60 + -1;
        local_1c = local_1c + 1;
      }
      local_1c = local_1c - 1;
    }
    else if (0x3a < uVar1) {
      local_60 = uVar1 - 0x39;
      if ((ulong)(local_20 + 1) < (ulong)local_1c + local_60) {
        return 0x17;
      }
      while (local_60 != 0) {
        *(undefined8 *)((long)local_28 + (ulong)local_1c * 8) = 0;
        local_60 = local_60 + -1;
        local_1c = local_1c + 1;
      }
      local_1c = local_1c - 1;
    }
    local_1c = local_1c + 1;
  }
  return 1;
}

Assistant:

static exr_result_t
hufUnpackEncTable (
    const uint8_t** pcode, // io: ptr to packed table (updated)
    uint64_t*       nLeft, // io: input size (in bytes), bytes left
    uint32_t        im,    // i : min hcode index
    uint32_t        iM,    // i : max hcode index
    uint64_t*       hcode)       // o : encoding table [HUF_ENCSIZE]
{
    const uint8_t* p  = *pcode;
    uint64_t       c  = 0;
    uint64_t       ni = *nLeft;
    uint64_t       nr;
    uint32_t       lc = 0;
    uint64_t       l, zerun;

    memset (hcode, 0, sizeof (uint64_t) * HUF_ENCSIZE);
    for (; im <= iM; im++)
    {
        nr = (((uintptr_t) p) - ((uintptr_t) *pcode));
        if (lc < 6 && nr >= ni) return EXR_ERR_OUT_OF_MEMORY;

        l = hcode[im] = getBits (6, &c, &lc, &p); // code length

        if (l == (uint64_t) LONG_ZEROCODE_RUN)
        {
            nr = (((uintptr_t) p) - ((uintptr_t) *pcode));
            if (lc < 8 && nr >= ni) return EXR_ERR_OUT_OF_MEMORY;

            zerun = getBits (8, &c, &lc, &p) + SHORTEST_LONG_RUN;

            if (im + zerun > iM + 1) return EXR_ERR_CORRUPT_CHUNK;

            while (zerun--)
                hcode[im++] = 0;

            im--;
        }
        else if (l >= (uint64_t) SHORT_ZEROCODE_RUN)
        {
            zerun = l - SHORT_ZEROCODE_RUN + 2;

            if (im + zerun > iM + 1) return EXR_ERR_CORRUPT_CHUNK;

            while (zerun--)
                hcode[im++] = 0;

            im--;
        }
    }

    nr = (((uintptr_t) p) - ((uintptr_t) *pcode));
    *nLeft -= nr;
    *pcode = p;

    hufCanonicalCodeTable (hcode);
    return EXR_ERR_SUCCESS;
}